

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool ra_overwrite(roaring_array_t *source,roaring_array_t *dest,_Bool copy_on_write)

{
  container_t *pcVar1;
  undefined1 in_DL;
  int *in_RSI;
  int *in_RDI;
  int32_t j;
  int32_t i_1;
  int32_t i;
  int local_28;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar3;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var4;
  
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  ra_clear_containers((roaring_array_t *)
                      (CONCAT44(CONCAT13(in_DL,in_stack_ffffffffffffffe4),in_stack_ffffffffffffffe0)
                      & 0x1ffffffffffffff));
  if (*in_RDI == 0) {
    *in_RSI = 0;
    _Var4 = true;
  }
  else if ((*in_RDI <= in_RSI[1]) ||
          (_Var4 = realloc_array((roaring_array_t *)CONCAT17(copy_on_write,_i),i_1), _Var4)) {
    *in_RSI = *in_RDI;
    memcpy(*(void **)(in_RSI + 4),*(void **)(in_RDI + 4),(long)*in_RSI << 1);
    if ((uVar3 & 0x1000000) == 0) {
      memcpy(*(void **)(in_RSI + 6),*(void **)(in_RDI + 6),(long)*in_RSI);
      for (iVar2 = 0; iVar2 < *in_RSI; iVar2 = iVar2 + 1) {
        pcVar1 = container_clone(in_RSI,(uint8_t)(uVar3 >> 0x18));
        *(container_t **)(*(long *)(in_RSI + 2) + (long)iVar2 * 8) = pcVar1;
        if (*(long *)(*(long *)(in_RSI + 2) + (long)iVar2 * 8) == 0) {
          for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
            container_free((container_t *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                           (uint8_t)((uint)iVar2 >> 0x18));
          }
          ra_clear_without_containers((roaring_array_t *)0x130cea);
          return false;
        }
      }
    }
    else {
      for (iVar2 = 0; iVar2 < *in_RSI; iVar2 = iVar2 + 1) {
        pcVar1 = get_copy_of_container
                           ((container_t *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                            (uint8_t *)in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
        *(container_t **)(*(long *)(in_RDI + 2) + (long)iVar2 * 8) = pcVar1;
      }
      memcpy(*(void **)(in_RSI + 2),*(void **)(in_RDI + 2),(long)*in_RSI << 3);
      memcpy(*(void **)(in_RSI + 6),*(void **)(in_RDI + 6),(long)*in_RSI);
    }
    _Var4 = true;
  }
  else {
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool ra_overwrite(const roaring_array_t *source, roaring_array_t *dest,
                  bool copy_on_write) {
    ra_clear_containers(dest);  // we are going to overwrite them
    if (source->size == 0) {    // Note: can't call memcpy(NULL), even w/size
        dest->size = 0;         // <--- This is important.
        return true;            // output was just cleared, so they match
    }
    if (dest->allocation_size < source->size) {
        if (!realloc_array(dest, source->size)) {
            return false;
        }
    }
    dest->size = source->size;
    memcpy(dest->keys, source->keys, dest->size * sizeof(uint16_t));
    // we go through the containers, turning them into shared containers...
    if (copy_on_write) {
        for (int32_t i = 0; i < dest->size; ++i) {
            source->containers[i] = get_copy_of_container(
                source->containers[i], &source->typecodes[i], copy_on_write);
        }
        // we do a shallow copy to the other bitmap
        memcpy(dest->containers, source->containers,
               dest->size * sizeof(container_t *));
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
    } else {
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
        for (int32_t i = 0; i < dest->size; i++) {
            dest->containers[i] =
                container_clone(source->containers[i], source->typecodes[i]);
            if (dest->containers[i] == NULL) {
                for (int32_t j = 0; j < i; j++) {
                    container_free(dest->containers[j], dest->typecodes[j]);
                }
                ra_clear_without_containers(dest);
                return false;
            }
        }
    }
    return true;
}